

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Deconvolution_x86::forward(Deconvolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  undefined8 *puVar7;
  long lVar8;
  float *pfVar9;
  undefined8 *in_RCX;
  Mat *in_RDX;
  long *in_RSI;
  Mat *in_RDI;
  bool bVar10;
  float fVar11;
  float fVar12;
  float w_2;
  int k;
  float val;
  int sx;
  int sxs;
  int x;
  float *sptr_2;
  int sy;
  int sys;
  int y;
  Mat m_4;
  int q;
  float *kptr;
  float sum;
  int j_2;
  int i_5;
  int outh_1;
  int outw_1;
  int channels;
  int h_1;
  int w_1;
  float *outptr;
  int p_2;
  int j_1;
  int i_4;
  float *ptr_4;
  int v_1;
  int u_1;
  float bias;
  Mat outm_1;
  float *sptr_1;
  int p_1;
  __m128 _s;
  __m128 _val;
  int j;
  int i_2;
  float *ptr_2;
  int v;
  int u;
  Mat outm;
  float *sptr;
  int p;
  int gap;
  int ret;
  Option opt_b;
  Mat top_col2im;
  Mat bottom_blob_2;
  int maxk;
  Mat top_blob_bordered;
  int out_channels;
  size_t out_elemsize;
  int out_elempack;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  int elempack;
  size_t elemsize;
  int h;
  int w;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  int i_1;
  float *ptr_1;
  int size_1;
  int i;
  float *ptr;
  int size;
  int i_3;
  float *ptr_3;
  int size_2;
  Mat *m_5;
  Mat *m_3;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  int in_stack_00001530;
  int in_stack_00001538;
  int in_stack_00001540;
  int in_stack_00001548;
  int in_stack_00001550;
  Mat *in_stack_00001558;
  Option *in_stack_00001560;
  int in_stack_000017b0;
  int in_stack_000017b8;
  int in_stack_000017c0;
  int in_stack_000017c8;
  int in_stack_000017d0;
  Mat *in_stack_000017d8;
  Option *in_stack_000017e0;
  int in_stack_fffffffffffff224;
  undefined4 in_stack_fffffffffffff228;
  undefined4 in_stack_fffffffffffff22c;
  undefined8 in_stack_fffffffffffff230;
  undefined8 in_stack_fffffffffffff238;
  int iVar13;
  Mat *in_stack_fffffffffffff240;
  Mat *in_stack_fffffffffffff248;
  Mat *in_stack_fffffffffffff250;
  Mat *pMVar14;
  undefined7 in_stack_fffffffffffff258;
  undefined1 in_stack_fffffffffffff25f;
  float local_d8c;
  Allocator *in_stack_fffffffffffff2a0;
  undefined4 local_cc8;
  int in_stack_fffffffffffff440;
  undefined4 in_stack_fffffffffffff444;
  int iVar15;
  Mat *bias_data;
  undefined7 in_stack_fffffffffffff450;
  undefined1 uVar16;
  Mat *in_stack_fffffffffffff458;
  Mat *in_stack_fffffffffffff460;
  undefined4 in_stack_fffffffffffff478;
  undefined4 in_stack_fffffffffffff47c;
  undefined4 in_stack_fffffffffffff480;
  undefined4 in_stack_fffffffffffff484;
  int local_b74;
  int local_b5c;
  undefined8 local_b58;
  undefined8 local_b50;
  undefined8 local_b48;
  undefined4 local_b40;
  long local_b38;
  undefined4 local_b30;
  undefined4 local_b2c;
  undefined4 local_b28;
  undefined4 local_b24;
  undefined4 local_b20;
  undefined8 local_b18;
  int local_b0c;
  undefined8 local_b08;
  undefined8 local_b00;
  undefined8 local_af8;
  undefined4 local_af0;
  undefined8 local_ae8;
  undefined4 local_ae0;
  undefined4 local_adc;
  undefined4 local_ad8;
  undefined4 local_ad4;
  int in_stack_fffffffffffff530;
  int in_stack_fffffffffffff534;
  Mat *in_stack_fffffffffffff538;
  Mat *in_stack_fffffffffffff540;
  undefined4 in_stack_fffffffffffff548;
  undefined4 in_stack_fffffffffffff54c;
  int iVar17;
  undefined4 in_stack_fffffffffffff550;
  int iVar18;
  undefined4 in_stack_fffffffffffff554;
  int iVar19;
  undefined8 local_a98;
  undefined8 local_a90;
  undefined8 local_a88;
  undefined4 local_a80;
  Allocator *local_a78;
  undefined4 local_a70;
  undefined4 local_a6c;
  undefined4 local_a68;
  undefined4 local_a64;
  undefined4 local_a60;
  undefined8 local_a58;
  void *local_a50;
  int local_a44;
  int local_a40;
  int local_a3c;
  float *local_a38;
  int local_a2c;
  int local_a28;
  undefined4 local_a24;
  undefined8 local_a20;
  undefined8 local_a18;
  undefined8 local_a10;
  undefined4 local_a08;
  Allocator *local_a00;
  undefined4 local_9f8;
  undefined4 local_9f4;
  undefined4 local_9f0;
  undefined4 local_9ec;
  undefined4 local_9e8;
  undefined8 local_9e0;
  float *local_9d8;
  int local_9cc;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  int local_9a0;
  int local_99c;
  undefined8 *local_998;
  int local_990;
  int local_98c;
  undefined8 local_988;
  undefined8 local_980;
  undefined8 local_978;
  undefined4 local_970;
  Allocator *local_968;
  undefined4 local_960;
  undefined4 local_95c;
  undefined4 local_958;
  undefined4 local_954;
  undefined4 local_950;
  undefined8 local_948;
  undefined8 *local_940;
  int local_934;
  int local_930;
  int local_92c;
  undefined8 local_928;
  Allocator *pAStack_920;
  undefined4 local_918;
  undefined4 uStack_914;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined4 local_908;
  undefined4 uStack_904;
  undefined4 uStack_900;
  undefined4 uStack_8fc;
  undefined4 local_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  void *local_8e8;
  int *local_8e0;
  long local_8d8;
  undefined4 local_8d0;
  long *local_8c8;
  undefined4 local_8c0;
  int local_8bc;
  undefined4 local_8b8;
  undefined4 local_8b4;
  undefined4 local_8b0;
  undefined8 local_8a8;
  void *local_8a0;
  int *local_898;
  long local_890;
  undefined4 local_888;
  long *local_880;
  undefined4 local_878;
  int local_874;
  undefined4 local_870;
  undefined4 local_86c;
  undefined4 local_868;
  long local_860;
  int local_854;
  int local_850;
  Mat local_840;
  int local_7f4;
  long local_7f0;
  int local_7e8;
  int local_7e4;
  int local_7e0;
  int local_7dc;
  int local_7d8;
  int local_7d4;
  ulong local_7d0;
  int local_7c8;
  int local_7c4;
  undefined8 *local_7c0;
  Mat *local_7b8;
  long *local_7b0;
  int local_79c;
  Mat *local_798;
  void **local_790;
  int local_784;
  int in_stack_fffffffffffff880;
  int in_stack_fffffffffffff888;
  int in_stack_fffffffffffff890;
  int in_stack_fffffffffffff898;
  int in_stack_fffffffffffff8a0;
  undefined4 in_stack_fffffffffffff8a8;
  undefined4 in_stack_fffffffffffff8ac;
  Option *in_stack_fffffffffffff8b0;
  int local_4cc;
  undefined8 *local_4c8;
  int local_49c;
  undefined8 *local_498;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  int local_3cc;
  undefined4 *local_3c8;
  float local_32c;
  float local_328;
  float local_324;
  float local_320;
  float local_31c;
  size_t *local_318;
  undefined4 local_310;
  float local_30c [3];
  size_t *local_300;
  undefined8 local_2f8;
  size_t *local_2f0;
  undefined8 local_2e8;
  size_t *local_2e0;
  undefined8 local_2d8;
  size_t *local_2d0;
  undefined8 local_2c8;
  size_t *local_2c0;
  undefined8 local_2b8;
  int local_2ac;
  Allocator *local_2a8;
  long local_2a0;
  undefined4 local_294;
  int local_290;
  int local_28c;
  undefined8 *local_288;
  long local_280;
  undefined4 local_274;
  long local_270;
  long local_268;
  undefined4 local_25c;
  int local_258;
  int local_254;
  undefined8 *local_250;
  int local_23c;
  ulong local_238;
  undefined8 *local_230;
  int local_224;
  undefined8 *local_218;
  int local_204;
  ulong local_200;
  undefined4 *local_1f8;
  int local_1ec;
  undefined8 *local_1e0;
  int local_1cc;
  size_t local_1c8;
  void *local_1c0;
  int local_1b4;
  undefined8 *local_1a8;
  undefined4 local_19c;
  long local_198;
  undefined4 local_18c;
  long local_188;
  undefined4 local_17c;
  long local_178;
  undefined4 local_16c;
  long local_168;
  undefined4 local_15c;
  long local_158;
  void *local_108;
  void *local_f8;
  void *local_b8;
  undefined8 *local_a0;
  undefined8 *local_98;
  undefined8 *local_90;
  Mat *local_88;
  Mat *local_80;
  Mat *local_78;
  Mat *local_70;
  int local_68;
  undefined4 local_64;
  void **local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 *local_28;
  
  iVar15 = (int)((ulong)in_stack_fffffffffffff230 >> 0x20);
  local_7c4 = *(int *)((long)in_RSI + 0x2c);
  local_7c8 = (int)in_RSI[6];
  local_7d0 = in_RSI[2];
  local_7d4 = (int)in_RSI[3];
  local_7d8 = *(int *)((long)&in_RDI[3].data + 4) * (*(int *)((long)&in_RDI[2].cstep + 4) + -1) + 1;
  local_7dc = *(int *)&in_RDI[3].refcount * (*(int *)&in_RDI[3].data + -1) + 1;
  local_7e0 = (local_7c4 + -1) * *(int *)((long)&in_RDI[3].refcount + 4) + local_7d8 +
              *(int *)((long)&in_RDI[3].allocator + 4);
  local_7e4 = (local_7c8 + -1) * (int)in_RDI[3].elemsize + local_7dc + in_RDI[3].dims;
  local_7e8 = 1;
  if (((*(byte *)((long)in_RCX + 0x27) & 1) != 0) && (local_7e8 = 1, (int)in_RDI[2].cstep % 4 == 0))
  {
    local_7e8 = 4;
  }
  local_7f0 = (local_7d0 / (ulong)(long)local_7d4) * (long)local_7e8;
  local_7f4 = (int)in_RDI[2].cstep / local_7e8;
  pMVar14 = &local_840;
  local_840.data = (void *)0x0;
  local_840.refcount = (int *)0x0;
  local_840.elemsize = 0;
  local_840.elempack = 0;
  local_840.allocator = (Allocator *)0x0;
  local_840.dims = 0;
  local_840.w = 0;
  local_840.h = 0;
  local_840.d = 0;
  local_840.c = 0;
  local_840.cstep = 0;
  iVar13 = (int)((ulong)in_stack_fffffffffffff238 >> 0x20);
  local_7c0 = in_RCX;
  local_7b8 = in_RDX;
  local_7b0 = in_RSI;
  local_798 = pMVar14;
  if ((((*(int *)((long)&in_RDI[3].elemsize + 4) < 1) && (in_RDI[3].elempack < 1)) &&
      (*(int *)&in_RDI[3].field_0x1c < 1)) &&
     ((*(int *)&in_RDI[3].allocator < 1 && ((in_RDI[3].w < 1 || (in_RDI[3].h < 1)))))) {
    in_stack_fffffffffffff460 = &local_840;
    if (in_stack_fffffffffffff460 != in_RDX) {
      if (in_RDX->refcount != (int *)0x0) {
        LOCK();
        *in_RDX->refcount = *in_RDX->refcount + 1;
        UNLOCK();
      }
      local_840.data = in_RDX->data;
      local_840.refcount = in_RDX->refcount;
      local_840.elemsize = in_RDX->elemsize;
      local_840.elempack = in_RDX->elempack;
      local_840.allocator = in_RDX->allocator;
      local_840.dims = in_RDX->dims;
      local_840.w = in_RDX->w;
      local_840.h = in_RDX->h;
      local_840.d = in_RDX->d;
      local_840.c = in_RDX->c;
      local_840.cstep = in_RDX->cstep;
      in_stack_fffffffffffff458 = in_stack_fffffffffffff460;
    }
    Mat::create(in_stack_fffffffffffff240,iVar13,(int)in_stack_fffffffffffff238,iVar15,
                CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228),
                in_stack_fffffffffffff224,in_stack_fffffffffffff2a0);
  }
  else {
    Mat::create(in_stack_fffffffffffff240,iVar13,(int)in_stack_fffffffffffff238,iVar15,
                CONCAT44(in_stack_fffffffffffff22c,in_stack_fffffffffffff228),
                in_stack_fffffffffffff224,in_stack_fffffffffffff2a0);
  }
  bias_data = &local_840;
  if (local_840.data != (void *)0x0) {
    local_88 = bias_data;
  }
  uVar16 = local_840.data == (void *)0x0 || local_840.cstep * (long)local_840.c == 0;
  iVar15 = CONCAT13(uVar16,(int3)in_stack_fffffffffffff444);
  if ((bool)uVar16) {
    local_79c = -100;
    local_850 = 1;
  }
  else {
    local_854 = *(int *)((long)&in_RDI[2].cstep + 4) * *(int *)&in_RDI[3].data;
    if ((*(byte *)((long)local_7c0 + 0x1d) & 1) == 0) {
      if ((local_7d4 == 4) && (local_7e8 == 4)) {
        deconvolution_pack4_sse
                  ((Mat *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                   (Mat *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548),
                   in_stack_fffffffffffff540,in_stack_fffffffffffff538,in_stack_fffffffffffff534,
                   in_stack_fffffffffffff530,in_stack_000017b0,in_stack_000017b8,in_stack_000017c0,
                   in_stack_000017c8,in_stack_000017d0,in_stack_000017d8,in_stack_000017e0);
      }
      if ((local_7d4 == 1) && (local_7e8 == 4)) {
        deconvolution_pack1to4_sse
                  ((Mat *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480),
                   (Mat *)CONCAT44(in_stack_fffffffffffff47c,in_stack_fffffffffffff478),in_RDI,
                   pMVar14,(int)((ulong)in_stack_fffffffffffff460 >> 0x20),
                   (int)in_stack_fffffffffffff460,in_stack_00001530,in_stack_00001538,
                   in_stack_00001540,in_stack_00001548,in_stack_00001550,in_stack_00001558,
                   in_stack_00001560);
      }
      if ((local_7d4 == 4) && (local_7e8 == 1)) {
        deconvolution_pack4to1_sse
                  (in_stack_fffffffffffff460,in_stack_fffffffffffff458,
                   (Mat *)CONCAT17(uVar16,in_stack_fffffffffffff450),bias_data,iVar15,
                   in_stack_fffffffffffff440,in_stack_fffffffffffff880,in_stack_fffffffffffff888,
                   in_stack_fffffffffffff890,in_stack_fffffffffffff898,in_stack_fffffffffffff8a0,
                   (Mat *)CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                   in_stack_fffffffffffff8b0);
      }
      if ((local_7d4 == 1) && (local_7e8 == 1)) {
        for (local_a44 = 0; iVar15 = local_840.w, local_a44 < (int)in_RDI[2].cstep;
            local_a44 = local_a44 + 1) {
          local_a50 = (void *)((long)local_840.data +
                              local_840.cstep * (long)local_a44 * local_840.elemsize);
          local_1a8 = &local_a98;
          local_198 = (long)local_840.w * (long)local_840.h * local_840.elemsize;
          local_a78 = local_840.allocator;
          local_19c = 0x10;
          local_1b4 = local_840.d;
          local_1c8 = local_840.elemsize;
          local_1cc = local_840.elempack;
          local_a98 = 0;
          local_a88 = 0;
          local_a80 = 0;
          local_a70 = 0;
          local_a6c = 0;
          local_a68 = 0;
          local_a64 = 0;
          local_a60 = 0;
          local_a58 = 0;
          local_a90 = 0;
          iVar13 = *(int *)((long)local_7b0 + 0x2c);
          lVar3 = local_7b0[6];
          lVar4 = local_7b0[7];
          iVar19 = local_840.h;
          local_1c0 = local_a50;
          for (iVar18 = 0; iVar18 < iVar19; iVar18 = iVar18 + 1) {
            for (iVar17 = 0; iVar17 < iVar15; iVar17 = iVar17 + 1) {
              local_d8c = 0.0;
              if (in_RDI[3].d != 0) {
                local_d8c = *(float *)((long)in_RDI[6].data + (long)local_a44 * 4);
              }
              local_28c = *(int *)&in_RDI[7].field_0x3c;
              local_290 = (int)in_RDI[7].cstep;
              local_294 = *(undefined4 *)((long)&in_RDI[7].cstep + 4);
              local_2a0 = in_RDI[7].elemsize +
                          (long)in_RDI[8].refcount * (long)local_a44 * (long)in_RDI[7].allocator;
              local_2a8 = in_RDI[7].allocator;
              local_2ac = in_RDI[7].dims;
              local_2b8._0_4_ = in_RDI[7].h;
              local_2b8._4_4_ = in_RDI[7].d;
              local_288 = &local_b08;
              local_158 = (long)local_28c * (long)local_290 * (long)local_2a8;
              local_15c = 0x10;
              local_b08 = 0;
              local_af8 = 0;
              local_af0 = 0;
              local_ae0 = 0;
              local_adc = 0;
              local_ad8 = 0;
              local_ad4 = 0;
              local_b00 = 0;
              lVar8 = local_2a0;
              for (local_b0c = 0; local_b0c < (int)lVar4; local_b0c = local_b0c + 1) {
                local_254 = *(int *)((long)local_7b0 + 0x2c);
                local_258 = (int)local_7b0[6];
                local_25c = *(undefined4 *)((long)local_7b0 + 0x34);
                local_268 = *local_7b0 + local_7b0[8] * (long)local_b0c * local_7b0[2];
                local_270 = local_7b0[2];
                local_274 = (undefined4)local_7b0[3];
                local_280 = local_7b0[4];
                local_250 = &local_b58;
                local_168 = (long)local_254 * (long)local_258 * local_270;
                local_16c = 0x10;
                for (local_b5c = 0; local_b5c < *(int *)&in_RDI[3].data; local_b5c = local_b5c + 1)
                {
                  iVar5 = (iVar18 + local_b5c * *(int *)&in_RDI[3].refcount) - (local_7dc + -1);
                  if (((-1 < iVar5) && (iVar5 % (int)in_RDI[3].elemsize == 0)) &&
                     (iVar5 = iVar5 / (int)in_RDI[3].elemsize, iVar5 < (int)lVar3)) {
                    for (local_b74 = 0; local_b74 < *(int *)((long)&in_RDI[2].cstep + 4);
                        local_b74 = local_b74 + 1) {
                      iVar6 = (iVar17 + local_b74 * *(int *)((long)&in_RDI[3].data + 4)) -
                              (local_7d8 + -1);
                      if (((-1 < iVar6) && (iVar6 % *(int *)((long)&in_RDI[3].refcount + 4) == 0))
                         && (iVar6 = iVar6 / *(int *)((long)&in_RDI[3].refcount + 4), iVar6 < iVar13
                            )) {
                        local_d8c = *(float *)(local_268 + (long)local_254 * (long)iVar5 * local_270
                                              + (long)iVar6 * 4) *
                                    *(float *)(lVar8 + (long)(local_b5c *
                                                              *(int *)((long)&in_RDI[2].cstep + 4) +
                                                             local_b74) * 4) + local_d8c;
                      }
                    }
                  }
                }
                lVar8 = lVar8 + (long)local_854 * 4;
                local_b58 = 0;
                local_b48 = 0;
                local_b40 = 0;
                local_b30 = 0;
                local_b2c = 0;
                local_b28 = 0;
                local_b24 = 0;
                local_b20 = 0;
                local_b18 = 0;
                local_b50 = 0;
                local_b38 = local_280;
              }
              local_310 = *(undefined4 *)&in_RDI[3].field_0x3c;
              local_318 = &in_RDI[3].cstep;
              local_30c[0] = local_d8c;
              local_ae8 = local_2b8;
              switch(local_310) {
              case 1:
                if (local_d8c <= 0.0) {
                  local_30c[0] = 0.0;
                }
                break;
              case 2:
                local_2c8 = 0;
                local_31c = *(float *)*local_318;
                if (local_d8c <= 0.0) {
                  local_d8c = local_d8c * local_31c;
                }
                local_30c[0] = local_d8c;
                local_2c0 = local_318;
                break;
              case 3:
                local_2d8 = 0;
                local_320 = *(float *)*local_318;
                local_2e8 = 1;
                local_324 = *(float *)(*local_318 + 4);
                if (local_d8c < local_320) {
                  local_30c[0] = local_320;
                }
                local_2e0 = local_318;
                local_2d0 = local_318;
                if (local_324 < local_30c[0]) {
                  local_30c[0] = local_324;
                }
                break;
              case 4:
                local_328 = 88.37626;
                pfVar9 = std::min<float>(local_30c,&local_328);
                local_30c[0] = *pfVar9;
                local_32c = -88.37626;
                pfVar9 = std::max<float>(local_30c,&local_32c);
                local_30c[0] = *pfVar9;
                fVar11 = expf(-local_30c[0]);
                local_30c[0] = 1.0 / (fVar11 + 1.0);
                break;
              case 5:
                fVar11 = expf(local_d8c);
                fVar11 = logf(fVar11 + 1.0);
                local_30c[0] = tanhf(fVar11);
                local_30c[0] = local_d8c * local_30c[0];
                break;
              case 6:
                local_2f8 = 0;
                fVar11 = *(float *)*local_318;
                local_30c[1] = 1.4013e-45;
                local_30c[2] = 0.0;
                fVar12 = -*(float *)(*local_318 + 4) / fVar11;
                local_300 = local_318;
                local_2f0 = local_318;
                if (fVar12 <= local_d8c) {
                  if (local_d8c <= 1.0 / fVar11 + fVar12) {
                    local_30c[0] = local_d8c * (local_d8c * fVar11 + *(float *)(*local_318 + 4));
                  }
                }
                else {
                  local_30c[0] = 0.0;
                }
              }
              *(float *)((long)local_a50 + (long)iVar17 * 4) = local_30c[0];
            }
            local_a50 = (void *)((long)local_a50 + (long)iVar15 * 4);
          }
        }
      }
    }
    else {
      local_60 = &local_8a0;
      local_8a0 = (void *)*local_7b0;
      local_898 = (int *)local_7b0[1];
      local_890 = local_7b0[2];
      local_888 = (undefined4)local_7b0[3];
      local_880 = (long *)local_7b0[4];
      local_878 = (undefined4)local_7b0[5];
      local_86c = *(undefined4 *)((long)local_7b0 + 0x34);
      local_868 = (undefined4)local_7b0[7];
      local_860 = local_7b0[8];
      if (local_898 != (int *)0x0) {
        local_64 = 1;
        LOCK();
        local_68 = *local_898;
        *local_898 = *local_898 + 1;
        UNLOCK();
      }
      local_874 = *(int *)((long)local_7b0 + 0x2c) * (int)local_7b0[6];
      local_870 = 1;
      local_790 = &local_8e8;
      local_8e8 = (void *)0x0;
      local_8e0 = (int *)0x0;
      local_8d8 = 0;
      local_8d0 = 0;
      local_8c8 = (long *)0x0;
      local_8c0 = 0;
      local_8bc = 0;
      local_8b8 = 0;
      local_8b4 = 0;
      local_8b0 = 0;
      local_8a8 = 0;
      local_928 = *local_7c0;
      local_918 = *(undefined4 *)(local_7c0 + 2);
      uStack_914 = *(undefined4 *)((long)local_7c0 + 0x14);
      uStack_910 = *(undefined4 *)(local_7c0 + 3);
      uStack_90c = *(undefined4 *)((long)local_7c0 + 0x1c);
      local_908 = *(undefined4 *)(local_7c0 + 4);
      uStack_904 = *(undefined4 *)((long)local_7c0 + 0x24);
      uStack_900 = *(undefined4 *)(local_7c0 + 5);
      uStack_8fc = *(undefined4 *)((long)local_7c0 + 0x2c);
      local_8f8 = *(undefined4 *)(local_7c0 + 6);
      uStack_8f4 = *(undefined4 *)((long)local_7c0 + 0x34);
      uStack_8f0 = *(undefined4 *)(local_7c0 + 7);
      uStack_8ec = *(undefined4 *)((long)local_7c0 + 0x3c);
      pAStack_920 = local_840.allocator;
      local_92c = (**(code **)(*(long *)in_RDI[7].refcount + 0x38))
                            (in_RDI[7].refcount,&local_8a0,&local_8e8,&local_928);
      if (local_92c == 0) {
        local_930 = (local_7e0 * (int)in_RDI[3].elemsize -
                    local_7c4 * *(int *)((long)&in_RDI[3].refcount + 4)) * local_7e8;
        if (local_7e8 == 4) {
          for (local_934 = 0; local_934 < local_7f4; local_934 = local_934 + 1) {
            local_940 = (undefined8 *)
                        ((long)local_8e8 +
                        (long)local_8bc * (long)(local_934 * local_854) * local_8d8);
            local_230 = (undefined8 *)
                        ((long)local_840.data +
                        local_840.cstep * (long)local_934 * local_840.elemsize);
            local_218 = &local_988;
            local_968 = local_840.allocator;
            local_178 = (long)local_840.w * (long)local_840.h * local_840.elemsize;
            local_948._0_4_ = (int)((local_178 + 0xfU & 0xfffffffffffffff0) / local_840.elemsize);
            if (local_840.dims == 4) {
              local_948._0_4_ = local_840.w * local_840.h;
            }
            local_17c = 0x10;
            local_224 = local_840.d;
            local_238 = local_840.elemsize;
            local_23c = local_840.elempack;
            bVar10 = true;
            if (in_RDI[6].data != (void *)0x0) {
              bVar10 = in_RDI[6].cstep * (long)in_RDI[6].c == 0;
              local_80 = in_RDI + 6;
            }
            if (bVar10) {
              local_98 = &local_988;
              local_498 = local_230;
              for (local_49c = 0; local_49c < (int)local_948 * local_840.d;
                  local_49c = local_49c + 1) {
                local_40 = local_498;
                local_58 = 0;
                uStack_50 = 0;
                *local_498 = 0;
                local_498[1] = 0;
                local_498 = local_498 + 2;
              }
            }
            else {
              puVar7 = (undefined8 *)((long)in_RDI[6].data + (long)(local_934 << 2) * 4);
              uVar1 = *puVar7;
              uVar2 = puVar7[1];
              local_90 = &local_988;
              local_4c8 = local_230;
              for (local_4cc = 0; local_4cc < (int)local_948 * local_840.d;
                  local_4cc = local_4cc + 1) {
                local_28 = local_4c8;
                *local_4c8 = uVar1;
                local_4c8[1] = uVar2;
                local_4c8 = local_4c8 + 2;
                local_38 = uVar1;
                uStack_30 = uVar2;
              }
            }
            for (local_98c = 0; local_98c < *(int *)&in_RDI[3].data; local_98c = local_98c + 1) {
              for (local_990 = 0; local_990 < *(int *)((long)&in_RDI[2].cstep + 4);
                  local_990 = local_990 + 1) {
                local_998 = (undefined8 *)
                            ((long)local_230 +
                            (long)(*(int *)((long)&in_RDI[3].data + 4) * local_990 * 4) * 4 +
                            (long)local_840.w * (long)(*(int *)&in_RDI[3].refcount * local_98c) *
                            local_840.elemsize);
                for (local_99c = 0; local_99c < local_7c8; local_99c = local_99c + 1) {
                  for (local_9a0 = 0; local_9a0 < local_7c4; local_9a0 = local_9a0 + 1) {
                    local_9c8 = *local_940;
                    uStack_9c0 = local_940[1];
                    local_418 = (float)*local_998;
                    fStack_414 = (float)((ulong)*local_998 >> 0x20);
                    fStack_410 = (float)local_998[1];
                    fStack_40c = (float)((ulong)local_998[1] >> 0x20);
                    local_428 = (float)local_9c8;
                    fStack_424 = (float)((ulong)local_9c8 >> 0x20);
                    fStack_420 = (float)uStack_9c0;
                    fStack_41c = (float)((ulong)uStack_9c0 >> 0x20);
                    local_9b8 = CONCAT44(fStack_414 + fStack_424,local_418 + local_428);
                    uStack_9b0 = CONCAT44(fStack_40c + fStack_41c,fStack_410 + fStack_420);
                    *local_998 = local_9b8;
                    local_998[1] = uStack_9b0;
                    local_998 = (undefined8 *)
                                ((long)local_998 +
                                (long)(*(int *)((long)&in_RDI[3].refcount + 4) << 2) * 4);
                    local_940 = local_940 + 2;
                  }
                  local_998 = (undefined8 *)((long)local_998 + (long)local_930 * 4);
                }
              }
            }
            local_988 = 0;
            local_978 = 0;
            local_970 = 0;
            local_960 = 0;
            local_95c = 0;
            local_958 = 0;
            local_954 = 0;
            local_950 = 0;
            local_948 = 0;
            local_980 = 0;
          }
        }
        if (local_7e8 == 1) {
          for (local_9cc = 0; local_9cc < local_7f4; local_9cc = local_9cc + 1) {
            local_9d8 = (float *)((long)local_8e8 +
                                 (long)local_8bc * (long)(local_9cc * local_854) * local_8d8);
            local_1f8 = (undefined4 *)
                        ((long)local_840.data +
                        local_840.cstep * (long)local_9cc * local_840.elemsize);
            local_1e0 = &local_a20;
            local_a00 = local_840.allocator;
            local_188 = (long)local_840.w * (long)local_840.h * local_840.elemsize;
            local_9e0._0_4_ = (int)((local_188 + 0xfU & 0xfffffffffffffff0) / local_840.elemsize);
            if (local_840.dims == 4) {
              local_9e0._0_4_ = local_840.w * local_840.h;
            }
            local_18c = 0x10;
            local_1ec = local_840.d;
            local_200 = local_840.elemsize;
            local_204 = local_840.elempack;
            bVar10 = true;
            if (in_RDI[6].data != (void *)0x0) {
              bVar10 = in_RDI[6].cstep * (long)in_RDI[6].c == 0;
              local_78 = in_RDI + 6;
            }
            if (bVar10) {
              local_cc8 = 0;
            }
            else {
              local_cc8 = *(undefined4 *)((long)in_RDI[6].data + (long)local_9cc * 4);
            }
            local_a24 = local_cc8;
            local_a0 = &local_a20;
            local_3c8 = local_1f8;
            for (local_3cc = 0; local_3cc < (int)local_9e0 * local_840.d; local_3cc = local_3cc + 1)
            {
              *local_3c8 = local_cc8;
              local_3c8 = local_3c8 + 1;
            }
            for (local_a28 = 0; local_a28 < *(int *)&in_RDI[3].data; local_a28 = local_a28 + 1) {
              for (local_a2c = 0; local_a2c < *(int *)((long)&in_RDI[2].cstep + 4);
                  local_a2c = local_a2c + 1) {
                local_784 = *(int *)&in_RDI[3].refcount * local_a28;
                local_a38 = (float *)((long)local_1f8 +
                                     (long)(*(int *)((long)&in_RDI[3].data + 4) * local_a2c) * 4 +
                                     (long)local_840.w * (long)local_784 * local_840.elemsize);
                for (local_a3c = 0; local_a3c < local_7c8; local_a3c = local_a3c + 1) {
                  for (local_a40 = 0; local_a40 < local_7c4; local_a40 = local_a40 + 1) {
                    *local_a38 = *local_9d8 + *local_a38;
                    local_a38 = local_a38 + *(int *)((long)&in_RDI[3].refcount + 4);
                    local_9d8 = local_9d8 + 1;
                  }
                  local_a38 = local_a38 + local_930;
                }
              }
            }
            local_a20 = 0;
            local_a10 = 0;
            local_a08 = 0;
            local_9f8 = 0;
            local_9f4 = 0;
            local_9f0 = 0;
            local_9ec = 0;
            local_9e8 = 0;
            local_9e0 = 0;
            local_a18 = 0;
          }
        }
        if (in_RDI[7].data != (void *)0x0) {
          (**(code **)(*in_RDI[7].data + 0x48))(in_RDI[7].data,&local_840,local_7c0);
        }
        local_850 = 0;
      }
      else {
        local_850 = 1;
        local_79c = local_92c;
      }
      if (local_8e0 != (int *)0x0) {
        LOCK();
        iVar15 = *local_8e0;
        *local_8e0 = *local_8e0 + -1;
        UNLOCK();
        if (iVar15 == 1) {
          if (local_8c8 == (long *)0x0) {
            local_108 = local_8e8;
            if (local_8e8 != (void *)0x0) {
              free(local_8e8);
            }
          }
          else {
            (**(code **)(*local_8c8 + 0x18))(local_8c8,local_8e8);
          }
        }
      }
      local_8e8 = (void *)0x0;
      local_8d8 = 0;
      local_8d0 = 0;
      local_8c0 = 0;
      local_8bc = 0;
      local_8b8 = 0;
      local_8b4 = 0;
      local_8b0 = 0;
      local_8a8 = 0;
      local_8e0 = (int *)0x0;
      if (local_898 != (int *)0x0) {
        LOCK();
        iVar15 = *local_898;
        *local_898 = *local_898 + -1;
        UNLOCK();
        if (iVar15 == 1) {
          if (local_880 == (long *)0x0) {
            local_f8 = local_8a0;
            if (local_8a0 != (void *)0x0) {
              free(local_8a0);
            }
          }
          else {
            (**(code **)(*local_880 + 0x18))(local_880,local_8a0);
          }
        }
      }
      local_8a0 = (void *)0x0;
      local_890 = 0;
      local_888 = 0;
      local_878 = 0;
      local_874 = 0;
      local_870 = 0;
      local_86c = 0;
      local_868 = 0;
      local_860 = 0;
      local_898 = (int *)0x0;
      if (local_850 != 0) goto LAB_00993869;
    }
    Deconvolution::cut_padding
              ((Deconvolution *)CONCAT17(in_stack_fffffffffffff25f,in_stack_fffffffffffff258),
               in_stack_fffffffffffff250,in_stack_fffffffffffff248,
               (Option *)in_stack_fffffffffffff240);
    bVar10 = true;
    if (local_7b8->data != (void *)0x0) {
      local_70 = local_7b8;
      bVar10 = local_7b8->cstep * (long)local_7b8->c == 0;
    }
    if (bVar10) {
      local_79c = -100;
      local_850 = 1;
    }
    else {
      local_79c = 0;
      local_850 = 1;
    }
  }
LAB_00993869:
  pMVar14 = &local_840;
  if (local_840.refcount != (int *)0x0) {
    LOCK();
    iVar15 = *local_840.refcount;
    *local_840.refcount = *local_840.refcount + -1;
    UNLOCK();
    if (iVar15 == 1) {
      if (local_840.allocator == (Allocator *)0x0) {
        local_b8 = local_840.data;
        if (local_840.data != (void *)0x0) {
          free(local_840.data);
        }
      }
      else {
        (*(local_840.allocator)->_vptr_Allocator[3])(local_840.allocator,local_840.data);
      }
    }
  }
  pMVar14->data = (void *)0x0;
  pMVar14->elemsize = 0;
  pMVar14->elempack = 0;
  pMVar14->dims = 0;
  pMVar14->w = 0;
  pMVar14->h = 0;
  pMVar14->d = 0;
  pMVar14->c = 0;
  pMVar14->cstep = 0;
  pMVar14->refcount = (int *)0x0;
  return local_79c;
}

Assistant:

int Deconvolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    int out_channels = num_output / out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    if (opt.use_sgemm_convolution)
    {
        // sgemm
        Mat bottom_blob_2 = bottom_blob;
        {
            bottom_blob_2.w = bottom_blob.w * bottom_blob.h;
            bottom_blob_2.h = 1;
        }
        Mat top_col2im;
        Option opt_b = opt;
        opt_b.blob_allocator = top_blob_bordered.allocator;
        int ret = gemm->forward(bottom_blob_2, top_col2im, opt_b);
        if (ret != 0)
            return ret;

        {
            // col2im
            const int gap = (outw * stride_h - w * stride_w) * out_elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 16)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm512_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm512_loadu_ps((const float*)bias_data + p * 16));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 16;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m512 _val = _mm512_load_ps(ptr);
                                    __m512 _s = _mm512_load_ps(sptr);
                                    _val = _mm512_add_ps(_val, _s);
                                    _mm512_store_ps(ptr, _val);

                                    ptr += stride_w * 16;
                                    sptr += 16;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX512F__

            if (out_elempack == 8)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm256_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm256_loadu_ps((const float*)bias_data + p * 8));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 8;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m256 _val = _mm256_load_ps(ptr);
                                    __m256 _s = _mm256_load_ps(sptr);
                                    _val = _mm256_add_ps(_val, _s);
                                    _mm256_store_ps(ptr, _val);

                                    ptr += stride_w * 8;
                                    sptr += 8;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX__

            if (out_elempack == 4)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm_loadu_ps((const float*)bias_data + p * 4));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 4;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m128 _val = _mm_load_ps(ptr);
                                    __m128 _s = _mm_load_ps(sptr);
                                    _val = _mm_add_ps(_val, _s);
                                    _mm_store_ps(ptr, _val);

                                    ptr += stride_w * 4;
                                    sptr += 4;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __SSE2__

            if (out_elempack == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    const float bias = bias_data.empty() ? 0.f : bias_data[p];
                    outm.fill(bias);

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    ptr[0] += sptr[0];

                                    ptr += stride_w;
                                    sptr += 1;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
        }

        if (activation)
        {
            activation->forward_inplace(top_blob_bordered, opt);
        }
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 16)
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 16)
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 8)
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 16)
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 4)
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 16)
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 1)
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX512F__

        if (elempack == 8 && out_elempack == 8)
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 8)
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 4)
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 8)
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 1)
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX__

        if (elempack == 4 && out_elempack == 4)
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 4)
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 1)
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __SSE2__

        if (elempack == 1 && out_elempack == 1)
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}